

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  int *piVar1;
  Pager *pPVar2;
  sqlite3_file *psVar3;
  uint uVar4;
  Pager *pPVar5;
  int iVar6;
  Btree *p;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zDbName == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = sqlite3FindDbName(db,zDbName);
  }
  if ((int)uVar4 < 0) {
    p = (Btree *)0x0;
  }
  else {
    p = db->aDb[uVar4].pBt;
  }
  if (p == (Btree *)0x0) {
    iVar6 = 1;
    goto LAB_00122bef;
  }
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar2 = p->pBt->pPager;
  if (op == 0x1c) {
    pPVar5 = (Pager *)&pPVar2->jfd;
    if (pPVar2->pWal != (Wal *)0x0) {
      pPVar5 = (Pager *)&pPVar2->pWal->pWalFd;
    }
LAB_00122bd2:
    *(sqlite3_vfs **)pArg = pPVar5->pVfs;
LAB_00122bd8:
    iVar6 = 0;
  }
  else {
    pPVar5 = pPVar2;
    if (op == 0x1b) goto LAB_00122bd2;
    psVar3 = pPVar2->fd;
    if (op == 7) {
      *(sqlite3_file **)pArg = psVar3;
      goto LAB_00122bd8;
    }
    if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
      iVar6 = 0xc;
    }
    else {
      iVar6 = (*psVar3->pMethods->xFileControl)(psVar3,op,pArg);
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
LAB_00122bef:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( fd->pMethods ){
      rc = sqlite3OsFileControl(fd, op, pArg);
    }else{
      rc = SQLITE_NOTFOUND;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}